

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_export.cpp
# Opt level: O2

string * duckdb::CreateFileName
                   (string *__return_storage_ptr__,string *id_suffix,TableCatalogEntry *table,
                   string *extension)

{
  bool bVar1;
  string *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string schema;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  string local_180;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  string local_c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  string local_40;
  
  SanitizeExportIdentifier
            (&local_160,&(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name);
  bVar1 = ::std::operator==(&(((table->super_StandardEntry).schema)->super_InCatalogEntry).
                             super_CatalogEntry.name,"main");
  if (bVar1) {
    ::std::__cxx11::string::string((string *)&local_40,"%s%s.%s",(allocator *)&local_180);
    ::std::__cxx11::string::string((string *)&local_60,(string *)&local_160);
    ::std::__cxx11::string::string((string *)&local_80,(string *)id_suffix);
    ::std::__cxx11::string::string((string *)&local_a0,(string *)extension);
    StringUtil::Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(StringUtil *)&local_40,&local_60,&local_80,&local_a0,in_R9);
    ::std::__cxx11::string::~string((string *)&local_a0);
    ::std::__cxx11::string::~string((string *)&local_80);
    ::std::__cxx11::string::~string((string *)&local_60);
    this = &local_40;
  }
  else {
    SanitizeExportIdentifier
              (&local_180,
               &(((table->super_StandardEntry).schema)->super_InCatalogEntry).super_CatalogEntry.
                name);
    ::std::__cxx11::string::string(local_c0,"%s_%s%s.%s",(allocator *)&stack0xfffffffffffffe7f);
    ::std::__cxx11::string::string((string *)&local_e0,(string *)&local_180);
    ::std::__cxx11::string::string((string *)&local_100,(string *)&local_160);
    ::std::__cxx11::string::string((string *)&local_120,(string *)id_suffix);
    ::std::__cxx11::string::string((string *)&local_140,(string *)extension);
    StringUtil::
    Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(StringUtil *)local_c0,&local_e0,&local_100,&local_120,
               &local_140,in_stack_fffffffffffffe78);
    ::std::__cxx11::string::~string((string *)&local_140);
    ::std::__cxx11::string::~string((string *)&local_120);
    ::std::__cxx11::string::~string((string *)&local_100);
    ::std::__cxx11::string::~string((string *)&local_e0);
    ::std::__cxx11::string::~string(local_c0);
    this = &local_180;
  }
  ::std::__cxx11::string::~string((string *)this);
  ::std::__cxx11::string::~string((string *)&local_160);
  return __return_storage_ptr__;
}

Assistant:

string CreateFileName(const string &id_suffix, TableCatalogEntry &table, const string &extension) {
	auto name = SanitizeExportIdentifier(table.name);
	if (table.schema.name == DEFAULT_SCHEMA) {
		return StringUtil::Format("%s%s.%s", name, id_suffix, extension);
	}
	auto schema = SanitizeExportIdentifier(table.schema.name);
	return StringUtil::Format("%s_%s%s.%s", schema, name, id_suffix, extension);
}